

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib554.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  int local_1c;
  int res;
  char *URL_local;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    local_1c = once(URL,true);
    if (local_1c == 0) {
      local_1c = once(URL,false);
    }
    curl_global_cleanup();
    URL_local._4_4_ = local_1c;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res = once(URL, TRUE); /* old */
  if(!res)
    res = once(URL, FALSE); /* new */

  curl_global_cleanup();

  return res;
}